

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseBlockDeclaration(WastParser *this,BlockDeclaration *decl)

{
  bool bVar1;
  Result RVar2;
  undefined1 local_a0 [8];
  FuncDeclaration func_decl;
  BlockDeclaration *decl_local;
  WastParser *this_local;
  
  func_decl.sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)decl;
  FuncDeclaration::FuncDeclaration((FuncDeclaration *)local_a0);
  RVar2 = ParseTypeUseOpt(this,(FuncDeclaration *)local_a0);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = ParseUnboundFuncSignature
                      (this,(FuncSignature *)((long)&func_decl.type_var.field_2 + 0x18));
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      *(undefined1 *)
       &(func_decl.sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage)->enum_ = local_a0[0] & ~I64;
      Var::operator=((Var *)(func_decl.sig.result_types.
                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 2),(Var *)&func_decl);
      FuncSignature::operator=
                ((FuncSignature *)
                 (func_decl.sig.result_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 0x14),
                 (FuncSignature *)((long)&func_decl.type_var.field_2 + 0x18));
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  FuncDeclaration::~FuncDeclaration((FuncDeclaration *)local_a0);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseBlockDeclaration(BlockDeclaration* decl) {
  WABT_TRACE(ParseBlockDeclaration);
  FuncDeclaration func_decl;
  CHECK_RESULT(ParseTypeUseOpt(&func_decl));
  CHECK_RESULT(ParseUnboundFuncSignature(&func_decl.sig));
  decl->has_func_type = func_decl.has_func_type;
  decl->type_var = func_decl.type_var;
  decl->sig = func_decl.sig;
  return Result::Ok;
}